

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

FunctionDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FunctionDeclarationSyntax,slang::syntax::SyntaxKind&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::SyntaxNode>const&,slang::parsing::Token&,slang::syntax::NamedBlockClauseSyntax*&>
          (BumpAllocator *this,SyntaxKind *args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,FunctionPrototypeSyntax *args_2
          ,Token *args_3,SyntaxList<slang::syntax::SyntaxNode> *args_4,Token *args_5,
          NamedBlockClauseSyntax **args_6)

{
  Token semi;
  Token end;
  FunctionDeclarationSyntax *this_00;
  
  this_00 = (FunctionDeclarationSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FunctionDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (FunctionDeclarationSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  end.kind = args_5->kind;
  end._2_1_ = args_5->field_0x2;
  end.numFlags.raw = (args_5->numFlags).raw;
  end.rawLen = args_5->rawLen;
  end.info = args_5->info;
  slang::syntax::FunctionDeclarationSyntax::FunctionDeclarationSyntax
            (this_00,*args,args_1,args_2,semi,args_4,end,*args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }